

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_dateTime(void)

{
  char cVar1;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  XSValue_Data *pXVar5;
  XSValue *pXVar6;
  wchar16 *pwVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  void *pvVar11;
  char *pcVar12;
  Status myStatus;
  Status myStatus_16;
  char iv_1 [20];
  char iv_2 [22];
  char iv_4 [23];
  char iv_3 [23];
  char iv_5 [26];
  char v_3 [26];
  char v_2 [26];
  char v_3_canrep [21];
  char v_2_canrep [21];
  char v_1_canrep [26];
  char v_1 [32];
  StrX local_230;
  char *local_220;
  Status local_214;
  ulong local_210;
  char local_208 [32];
  char local_1e8 [32];
  char local_1c8 [32];
  char local_1a8 [32];
  char local_188 [32];
  char local_168 [32];
  char local_148 [32];
  char local_128 [32];
  char local_108 [32];
  char local_e8 [32];
  char local_c8 [32];
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  
  builtin_strncpy(local_c8 + 0x10,":59:59.00389  \n",0x10);
  builtin_strncpy(local_c8,"   2000-12-31T23",0x10);
  builtin_strncpy(local_148 + 0x10,":20+13:30",10);
  builtin_strncpy(local_148,"2000-10-01T11:10",0x10);
  builtin_strncpy(local_168 + 0x10,":20-06:00",10);
  builtin_strncpy(local_168,"2000-10-01T11:10",0x10);
  builtin_strncpy(local_208,"0000-12-31T23:59:59",0x14);
  builtin_strncpy(local_1e8 + 0x10,"9:59Z",6);
  builtin_strncpy(local_1e8,"+2000-11-30T23:5",0x10);
  builtin_strncpy(local_1a8,"2000-02-28T23:59.1:59Z",0x17);
  builtin_strncpy(local_1c8,"2000-11-30T01:01:01Z99",0x17);
  builtin_strncpy(local_188 + 0x10,":01Z10:61",10);
  builtin_strncpy(local_188,"2000-02-28T01:01",0x10);
  builtin_strncpy(local_e8 + 0x10,":59.00389",10);
  builtin_strncpy(local_e8,"2000-12-31T23:59",0x10);
  builtin_strncpy(local_108 + 0x10,":20Z",5);
  builtin_strncpy(local_108,"2000-09-30T21:40",0x10);
  builtin_strncpy(local_128 + 0x10,":20Z",5);
  builtin_strncpy(local_128,"2000-10-01T17:10",0x10);
  local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
  local_230.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_230.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_230);
  if (cVar3 == '\0') {
    StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1226,local_c8,local_230.fLocalForm,1);
    StrX::~StrX(&local_230);
    errSeen = 1;
  }
  local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
  local_230.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_230.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_230);
  if (cVar3 == '\0') {
    StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1227,local_148,local_230.fLocalForm,1);
    StrX::~StrX(&local_230);
    errSeen = 1;
  }
  local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
  local_230.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_230.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_230);
  if (cVar3 == '\0') {
    StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1228,local_168,local_230.fLocalForm,1);
    StrX::~StrX(&local_230);
    errSeen = 1;
  }
  local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
  local_230.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_230.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_230);
  if (cVar3 == '\0') {
    if ((int)local_220 != 6) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      if (((ulong)local_220 & 0xffffffff) < 0xb) {
        pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
      }
      else {
        pcVar12 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122b,local_208,local_230.fLocalForm,"st_FOCA0002",pcVar12);
      goto LAB_0012ab6f;
    }
  }
  else {
    StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122b,local_208,local_230.fLocalForm,0);
LAB_0012ab6f:
    StrX::~StrX(&local_230);
    errSeen = 1;
  }
  local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
  local_230.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_230.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_230);
  if (cVar3 == '\0') {
    if ((int)local_220 != 6) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      if (((ulong)local_220 & 0xffffffff) < 0xb) {
        pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
      }
      else {
        pcVar12 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122c,local_1e8,local_230.fLocalForm,"st_FOCA0002",pcVar12);
      goto LAB_0012ac75;
    }
  }
  else {
    StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122c,local_1e8,local_230.fLocalForm,0);
LAB_0012ac75:
    StrX::~StrX(&local_230);
    errSeen = 1;
  }
  local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
  local_230.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_230.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_230);
  if (cVar3 == '\0') {
    if ((int)local_220 != 6) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      if (((ulong)local_220 & 0xffffffff) < 0xb) {
        pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
      }
      else {
        pcVar12 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122d,local_1a8,local_230.fLocalForm,"st_FOCA0002",pcVar12);
      goto LAB_0012ad7b;
    }
  }
  else {
    StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122d,local_1a8,local_230.fLocalForm,0);
LAB_0012ad7b:
    StrX::~StrX(&local_230);
    errSeen = 1;
  }
  local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
  local_230.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_230.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_230);
  if (cVar3 == '\0') {
    if ((int)local_220 != 9) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      if (((ulong)local_220 & 0xffffffff) < 0xb) {
        pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
      }
      else {
        pcVar12 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x122e,local_1c8,local_230.fLocalForm,"st_FODT0003",pcVar12);
      goto LAB_0012ae81;
    }
  }
  else {
    StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122e,local_1c8,local_230.fLocalForm,0);
LAB_0012ae81:
    StrX::~StrX(&local_230);
    errSeen = 1;
  }
  local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
  local_230.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_230.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_230);
  if (cVar3 == '\0') {
    if ((int)local_220 == 9) goto LAB_0012af93;
    StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    if (((ulong)local_220 & 0xffffffff) < 0xb) {
      pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
    }
    else {
      pcVar12 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x122f,local_188,local_230.fLocalForm,"st_FODT0003",pcVar12);
  }
  else {
    StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x122f,local_188,local_230.fLocalForm,0);
  }
  StrX::~StrX(&local_230);
  errSeen = 1;
LAB_0012af93:
  iVar10 = 1;
  do {
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x6;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1249,local_c8);
      StrX::~StrX(&local_230);
      errSeen = 1;
    }
    else {
      local_50 = 0xc000007d0;
      uStack_48 = 0x170000001f;
      local_40 = 0x3b0000003b;
      local_38 = 0x3f6fddebd9018e75;
      expValue.fValue.f_double = 2.54639504797146e-313;
      expValue._0_8_ = uStack_58;
      expValue.fValue._8_8_ = 0x170000001f;
      expValue.fValue._16_8_ = 0x3b0000003b;
      expValue.fValue.f_datetime.f_milisec = 0.00389;
      bVar4 = compareActualValue(dt_dateTime,*pXVar5,expValue);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x6;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124a,local_148);
      StrX::~StrX(&local_230);
      errSeen = 1;
    }
    else {
      local_78 = 0x9000007d0;
      uStack_70 = 0x150000001e;
      local_68 = 0x1400000028;
      local_60 = 0;
      expValue_00.fValue.f_double = 1.90979631068187e-313;
      expValue_00._0_8_ = uStack_80;
      expValue_00.fValue._8_8_ = 0x150000001e;
      expValue_00.fValue._16_8_ = 0x1400000028;
      expValue_00.fValue.f_datetime.f_milisec = 0.0;
      bVar4 = compareActualValue(dt_dateTime,*pXVar5,expValue_00);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x6;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124b,local_168);
      StrX::~StrX(&local_230);
      errSeen = 1;
    }
    else {
      local_a0 = 0xa000007d0;
      uStack_98 = 0x1100000001;
      local_90 = 0x140000000a;
      local_88 = 0;
      expValue_01.fValue.f_double = 2.1219958897784e-313;
      expValue_01._0_8_ = uStack_a8;
      expValue_01.fValue._8_8_ = 0x1100000001;
      expValue_01.fValue._16_8_ = 0x140000000a;
      expValue_01.fValue.f_datetime.f_milisec = 0.0;
      bVar4 = compareActualValue(dt_dateTime,*pXVar5,expValue_01);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_220 != 6) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x124e,local_208,local_230.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_230);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar11 = (void *)0x124e;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124e,local_208);
      StrX::~StrX(&local_230);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_220 != 6) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x124f,local_1e8,local_230.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_230);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar11 = (void *)0x124f;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x124f,local_1e8);
      StrX::~StrX(&local_230);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_220 != 6) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1250,local_1a8,local_230.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_230);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar11 = (void *)0x1250;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1250,local_1a8);
      StrX::~StrX(&local_230);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_220 != 9) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1251,local_1c8,local_230.fLocalForm,"st_FODT0003",pcVar12);
        StrX::~StrX(&local_230);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar11 = (void *)0x1251;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1251,local_1c8);
      StrX::~StrX(&local_230);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_220 != 9) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1252,local_188,local_230.fLocalForm,"st_FODT0003",pcVar12);
        StrX::~StrX(&local_230);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      pvVar11 = (void *)0x1252;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1252,local_188);
      StrX::~StrX(&local_230);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 == 0);
  local_210 = 0;
  do {
    iVar10 = (int)local_210;
    local_214 = st_Init;
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_230.fUnicodeForm,dt_dateTime,&local_214,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x126e,local_c8);
      StrX::~StrX(&local_230);
      errSeen = 1;
    }
    else {
      local_220 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_e8;
      if (local_220 != pcVar12) {
        pcVar8 = local_220;
        if (local_220 == (char *)0x0) {
LAB_0012b9f7:
          if (*pcVar12 == '\0') goto LAB_0012ba43;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0012b9f7;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x126e,local_c8,local_230.fLocalForm,local_220,local_e8);
        StrX::~StrX(&local_230);
        errSeen = 1;
      }
LAB_0012ba43:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_220,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    bVar4 = (int)local_210 == 0;
    local_214 = st_Init;
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_148,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_230.fUnicodeForm,dt_dateTime,&local_214,ver_10,bVar4,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x126f,local_148);
      StrX::~StrX(&local_230);
      errSeen = 1;
    }
    else {
      local_220 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_108;
      if (local_220 != pcVar12) {
        pcVar8 = local_220;
        if (local_220 == (char *)0x0) {
LAB_0012bb3c:
          if (*pcVar12 == '\0') goto LAB_0012bb88;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0012bb3c;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x126f,local_148,local_230.fLocalForm,local_220,local_108);
        StrX::~StrX(&local_230);
        errSeen = 1;
      }
LAB_0012bb88:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_220,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    bVar4 = (int)local_210 == 0;
    local_214 = st_Init;
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_168,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_230.fUnicodeForm,dt_dateTime,&local_214,ver_10,bVar4,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1270,local_168);
      StrX::~StrX(&local_230);
      errSeen = 1;
    }
    else {
      local_220 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_128;
      if (local_220 != pcVar12) {
        pcVar8 = local_220;
        if (local_220 == (char *)0x0) {
LAB_0012bc81:
          if (*pcVar12 == '\0') goto LAB_0012bccd;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0012bc81;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x1270,local_168,local_230.fLocalForm,local_220,local_128);
        StrX::~StrX(&local_230);
        errSeen = 1;
      }
LAB_0012bccd:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_220,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    bVar4 = (int)local_210 == 0;
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_208,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (lVar9 == 0) {
      if ((int)local_220 != 6) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1273,local_208,local_230.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_230);
        goto LAB_0012bdea;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1273,local_208);
      StrX::~StrX(&local_230);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_0012bdea:
      errSeen = 1;
    }
    bVar4 = (int)local_210 == 0;
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (lVar9 == 0) {
      if ((int)local_220 != 6) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1274,local_1e8,local_230.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_230);
        goto LAB_0012bef5;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1274,local_1e8);
      StrX::~StrX(&local_230);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_0012bef5:
      errSeen = 1;
    }
    bVar4 = (int)local_210 == 0;
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (lVar9 == 0) {
      if ((int)local_220 != 6) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1275,local_1a8,local_230.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_230);
        goto LAB_0012c000;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1275,local_1a8);
      StrX::~StrX(&local_230);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_0012c000:
      errSeen = 1;
    }
    bVar4 = (int)local_210 == 0;
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_1c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    if (lVar9 == 0) {
      if ((int)local_220 != 9) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1276,local_1c8,local_230.fLocalForm,"st_FODT0003",pcVar12);
        StrX::~StrX(&local_230);
        goto LAB_0012c10b;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1276,local_1c8);
      StrX::~StrX(&local_230);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_0012c10b:
      errSeen = 1;
    }
    bVar4 = (int)local_210 == 0;
    local_220 = (char *)((ulong)local_220 & 0xffffffff00000000);
    local_230.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_230.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_188,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_230.fUnicodeForm,dt_dateTime,(Status *)&local_220,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_230);
    uVar2 = local_210;
    if (lVar9 == 0) {
      if ((int)local_220 != 9) {
        StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_220 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_220 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1277,local_188,local_230.fLocalForm,"st_FODT0003",pcVar12);
        StrX::~StrX(&local_230);
        goto LAB_0012c21b;
      }
    }
    else {
      StrX::StrX(&local_230,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1277,local_188);
      StrX::~StrX(&local_230);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_0012c21b:
      errSeen = 1;
    }
    local_210 = (ulong)((int)uVar2 + 1);
    if ((int)uVar2 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_dateTime()
{
    const XSValue::DataType dt = XSValue::dt_dateTime;
    bool  toValidate = true;

    const char v_1[]="   2000-12-31T23:59:59.00389  \n";
    const char v_2[]="2000-10-01T11:10:20+13:30";
    const char v_3[]="2000-10-01T11:10:20-06:00";

    const char iv_1[]="0000-12-31T23:59:59";
    const char iv_2[]="+2000-11-30T23:59:59Z";
    const char iv_3[]="2000-02-28T23:59.1:59Z";
    const char iv_4[]="2000-11-30T01:01:01Z99";
    const char iv_5[]="2000-02-28T01:01:01Z10:61";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    const char v_1_canrep[]="2000-12-31T23:59:59.00389";
    const char v_2_canrep[]="2000-09-30T21:40:20Z";
    const char v_3_canrep[]="2000-10-01T17:10:20Z";

    act_v_ran_v_1.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 12;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 31;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 23;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 59;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 59;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0.00389;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 9;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 30;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 21;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 40;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 20;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 2000;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 10;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 1;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 17;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 10;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 20;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

 /***
 * E2-41
 *
 *  3.2.7.2 Canonical representation
 *
 *  Except for trailing fractional zero digits in the seconds representation,
 *  '24:00:00' time representations, and timezone (for timezoned values),
 *  the mapping from literals to values is one-to-one. Where there is more
 *  than one possible representation, the canonical representation is as follows:
 *  redundant trailing zero digits in fractional-second literals are prohibited.
 *  An hour representation of '24' is prohibited. Timezoned values are canonically
 *  represented by appending 'Z' to the nontimezoned representation. (All
 *  timezoned dateTime values are UTC.)
 *
 *  .'24:00:00' -> '00:00:00'
 *  .milisecond: trailing zeros removed
 *  .'Z'
 *
 ***/

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_4, dt, EXP_RET_VALID_FALSE, XSValue::st_FODT0003);
    VALIDATE_TEST(iv_5, dt, EXP_RET_VALID_FALSE, XSValue::st_FODT0003);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_4, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FODT0003, act_v_ran_v_1);
        ACTVALUE_TEST(iv_5, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FODT0003, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            n/a
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            n/a
     *   invalid                                          0              st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, v_1_canrep, DONT_CARE);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, v_2_canrep, DONT_CARE);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_TRUE, v_3_canrep, DONT_CARE);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FOCA0002);
        CANREP_TEST(iv_4, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FODT0003);
        CANREP_TEST(iv_5, dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_FODT0003);

    }

}